

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_ClearFreeMemory(ImDrawList *this)

{
  ImDrawCmd *ptr;
  unsigned_short *ptr_00;
  ImDrawVert *ptr_01;
  ImVec4 *ptr_02;
  void **ptr_03;
  ImVec2 *ptr_04;
  
  ptr = (this->CmdBuffer).Data;
  if (ptr != (ImDrawCmd *)0x0) {
    (this->CmdBuffer).Size = 0;
    (this->CmdBuffer).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  ptr_00 = (this->IdxBuffer).Data;
  if (ptr_00 != (unsigned_short *)0x0) {
    (this->IdxBuffer).Size = 0;
    (this->IdxBuffer).Capacity = 0;
    ImGui::MemFree(ptr_00);
    (this->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  ptr_01 = (this->VtxBuffer).Data;
  if (ptr_01 != (ImDrawVert *)0x0) {
    (this->VtxBuffer).Size = 0;
    (this->VtxBuffer).Capacity = 0;
    ImGui::MemFree(ptr_01);
    (this->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  this->Flags = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ptr_02 = (this->_ClipRectStack).Data;
  if (ptr_02 != (ImVec4 *)0x0) {
    (this->_ClipRectStack).Size = 0;
    (this->_ClipRectStack).Capacity = 0;
    ImGui::MemFree(ptr_02);
    (this->_ClipRectStack).Data = (ImVec4 *)0x0;
  }
  ptr_03 = (this->_TextureIdStack).Data;
  if (ptr_03 != (void **)0x0) {
    (this->_TextureIdStack).Size = 0;
    (this->_TextureIdStack).Capacity = 0;
    ImGui::MemFree(ptr_03);
    (this->_TextureIdStack).Data = (void **)0x0;
  }
  ptr_04 = (this->_Path).Data;
  if (ptr_04 != (ImVec2 *)0x0) {
    (this->_Path).Size = 0;
    (this->_Path).Capacity = 0;
    ImGui::MemFree(ptr_04);
    (this->_Path).Data = (ImVec2 *)0x0;
  }
  ImDrawListSplitter::ClearFreeMemory(&this->_Splitter);
  return;
}

Assistant:

void ImDrawList::_ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    Flags = ImDrawListFlags_None;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _Splitter.ClearFreeMemory();
}